

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

ostream * Minisat::operator<<(ostream *out,Clause *cls)

{
  ostream *poVar1;
  int i;
  ulong uVar2;
  Lit local_2c;
  
  for (uVar2 = 0; uVar2 < (ulong)cls->header >> 0x22; uVar2 = uVar2 + 1) {
    local_2c.x = *(int *)(&cls[1].header.field_0x0 + uVar2 * 4);
    poVar1 = operator<<(out,&local_2c);
    std::operator<<(poVar1," ");
  }
  return out;
}

Assistant:

inline std::ostream &operator<<(std::ostream &out, const Clause &cls)
{
    for (int i = 0; i < cls.size(); ++i) {
        out << cls[i] << " ";
    }

    return out;
}